

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O2

void __thiscall ast::FunctionStmt::FunctionStmt(FunctionStmt *this,Token *token,int line)

{
  Token TStack_48;
  
  ::token::Token::Token(&TStack_48,token);
  ExpressionStmt::ExpressionStmt(&this->super_ExpressionStmt,&TStack_48,line,FunctionStmtType);
  ::token::Token::~Token(&TStack_48);
  (this->super_ExpressionStmt).super_Stmt.super_Node._vptr_Node =
       (_func_int **)&PTR__ExpressionStmt_00122ad8;
  return;
}

Assistant:

FunctionStmt(Token token, int line)
        :ExpressionStmt(token, line, NodeType::FunctionStmtType){}